

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_tet2_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  long local_5c8;
  REF_INT local_5b8;
  long local_5b0;
  long local_590;
  long local_560;
  REF_INT local_550;
  long local_548;
  long local_528;
  long local_4f8;
  REF_INT local_4e8;
  long local_4e0;
  long local_4c0;
  long local_490;
  REF_INT local_480;
  long local_478;
  long local_458;
  int local_434;
  int local_408;
  int local_3dc;
  int local_3b0;
  long local_378;
  REF_INT local_368;
  long local_360;
  long local_340;
  long local_310;
  REF_INT local_300;
  long local_2f8;
  long local_2d8;
  long local_2a8;
  REF_INT local_298;
  long local_290;
  long local_270;
  long local_240;
  REF_INT local_230;
  long local_228;
  long local_208;
  int local_1e8;
  int local_1bc;
  int local_190;
  int local_164;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell;
  REF_INT nnodesg;
  REF_INT local [27];
  REF_INT global [27];
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_private_macro_code_rss = 5;
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0xa6,
           "ref_fixture_tet2_grid",(ulong)uVar2,"create");
    return uVar2;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node_00 = pRVar1->node;
  local[0x1a] = 0;
  if (0 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
    local_164 = 0 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_164 = -((ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                 ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  if (ref_mpi->id == local_164) {
LAB_00128422:
    uVar2 = ref_node_add(ref_node_00,0,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xb7,"ref_fixture_tet2_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = 0.0;
    ref_node_00->real[cell * 0xf + 1] = 0.0;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_208 = -1;
    }
    else {
      local_208 = ref_node_00->global[cell];
    }
    if (local_208 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(ref_private_macro_code_rss -
              ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_228 = -1;
      }
      else {
        local_228 = ref_node_00->global[cell];
      }
      local_230 = (REF_INT)(local_228 /
                           (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_240 = -1;
      }
      else {
        local_240 = ref_node_00->global[cell];
      }
      local_230 = (int)((local_240 -
                        (ref_private_macro_code_rss -
                        ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                        ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_230;
    uVar2 = ref_node_add(ref_node_00,1,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xb8,"ref_fixture_tet2_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[nnodesg * 0xf] = 1.0;
    ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_270 = -1;
    }
    else {
      local_270 = ref_node_00->global[nnodesg];
    }
    if (local_270 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(ref_private_macro_code_rss -
              ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_290 = -1;
      }
      else {
        local_290 = ref_node_00->global[nnodesg];
      }
      local_298 = (REF_INT)(local_290 /
                           (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_2a8 = -1;
      }
      else {
        local_2a8 = ref_node_00->global[nnodesg];
      }
      local_298 = (int)((local_2a8 -
                        (ref_private_macro_code_rss -
                        ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                        ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_298;
    uVar2 = ref_node_add(ref_node_00,2,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xb9,"ref_fixture_tet2_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 0.0;
    ref_node_00->real[local[0] * 0xf + 1] = 1.0;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_2d8 = -1;
    }
    else {
      local_2d8 = ref_node_00->global[local[0]];
    }
    if (local_2d8 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(ref_private_macro_code_rss -
              ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_2f8 = -1;
      }
      else {
        local_2f8 = ref_node_00->global[local[0]];
      }
      local_300 = (REF_INT)(local_2f8 /
                           (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_310 = -1;
      }
      else {
        local_310 = ref_node_00->global[local[0]];
      }
      local_300 = (int)((local_310 -
                        (ref_private_macro_code_rss -
                        ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                        ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_300;
    uVar2 = ref_node_add(ref_node_00,3,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xba,"ref_fixture_tet2_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[1] * 0xf] = 0.0;
    ref_node_00->real[local[1] * 0xf + 1] = 0.0;
    ref_node_00->real[local[1] * 0xf + 2] = 1.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_340 = -1;
    }
    else {
      local_340 = ref_node_00->global[local[1]];
    }
    if (local_340 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(ref_private_macro_code_rss -
              ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_360 = -1;
      }
      else {
        local_360 = ref_node_00->global[local[1]];
      }
      local_368 = (REF_INT)(local_360 /
                           (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_378 = -1;
      }
      else {
        local_378 = ref_node_00->global[local[1]];
      }
      local_368 = (int)((local_378 -
                        (ref_private_macro_code_rss -
                        ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                        ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_368;
    uVar2 = ref_cell_add(pRVar1->cell[8],&cell,&ref_private_macro_code_rss_1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0xbc,"ref_fixture_tet2_grid",(ulong)uVar2,"add tet");
      return uVar2;
    }
  }
  else {
    if (1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))
    {
      local_190 = 1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_190 = (1 - (ref_private_macro_code_rss -
                       ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                       ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_190) goto LAB_00128422;
    if (2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))
    {
      local_1bc = 2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_1bc = (2 - (ref_private_macro_code_rss -
                       ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                       ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_1bc) goto LAB_00128422;
    if (3 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))
    {
      local_1e8 = 3 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_1e8 = (3 - (ref_private_macro_code_rss -
                       ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                       ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_1e8) goto LAB_00128422;
  }
  local[0x1a] = 4;
  if (4 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
    local_3b0 = 4 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_3b0 = (4 - (ref_private_macro_code_rss -
                     ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                     ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  if (ref_mpi->id != local_3b0) {
    if (2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))
    {
      local_3dc = 2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_3dc = (2 - (ref_private_macro_code_rss -
                       ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                       ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    if (ref_mpi->id != local_3dc) {
      if (1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
          ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)
         ) {
        local_408 = 1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
      }
      else {
        local_408 = (1 - (ref_private_macro_code_rss -
                         ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                         ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                    ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                    (ref_private_macro_code_rss -
                    ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
      }
      if (ref_mpi->id != local_408) {
        if (3 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
            ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
          local_434 = 3 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
        }
        else {
          local_434 = (3 - (ref_private_macro_code_rss -
                           ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                           ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                      ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
        }
        if (ref_mpi->id != local_434) goto LAB_0012a74c;
      }
    }
  }
  uVar2 = ref_node_add(ref_node_00,4,&cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0xcc,
           "ref_fixture_tet2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[cell * 0xf] = 1.0;
  ref_node_00->real[cell * 0xf + 1] = 1.0;
  ref_node_00->real[cell * 0xf + 2] = 1.0;
  if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
    local_458 = -1;
  }
  else {
    local_458 = ref_node_00->global[cell];
  }
  if (local_458 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_478 = -1;
    }
    else {
      local_478 = ref_node_00->global[cell];
    }
    local_480 = (REF_INT)(local_478 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_490 = -1;
    }
    else {
      local_490 = ref_node_00->global[cell];
    }
    local_480 = (int)((local_490 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[cell] = local_480;
  uVar2 = ref_node_add(ref_node_00,2,&nnodesg);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0xcd,
           "ref_fixture_tet2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[nnodesg * 0xf] = 0.0;
  ref_node_00->real[nnodesg * 0xf + 1] = 1.0;
  ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
  if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
    local_4c0 = -1;
  }
  else {
    local_4c0 = ref_node_00->global[nnodesg];
  }
  if (local_4c0 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_4e0 = -1;
    }
    else {
      local_4e0 = ref_node_00->global[nnodesg];
    }
    local_4e8 = (REF_INT)(local_4e0 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_4f8 = -1;
    }
    else {
      local_4f8 = ref_node_00->global[nnodesg];
    }
    local_4e8 = (int)((local_4f8 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[nnodesg] = local_4e8;
  uVar2 = ref_node_add(ref_node_00,1,local);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0xce,
           "ref_fixture_tet2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[0] * 0xf] = 1.0;
  ref_node_00->real[local[0] * 0xf + 1] = 0.0;
  ref_node_00->real[local[0] * 0xf + 2] = 0.0;
  if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
    local_528 = -1;
  }
  else {
    local_528 = ref_node_00->global[local[0]];
  }
  if (local_528 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_548 = -1;
    }
    else {
      local_548 = ref_node_00->global[local[0]];
    }
    local_550 = (REF_INT)(local_548 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_560 = -1;
    }
    else {
      local_560 = ref_node_00->global[local[0]];
    }
    local_550 = (int)((local_560 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[local[0]] = local_550;
  uVar2 = ref_node_add(ref_node_00,3,local + 1);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0xcf,
           "ref_fixture_tet2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[1] * 0xf] = 0.0;
  ref_node_00->real[local[1] * 0xf + 1] = 0.0;
  ref_node_00->real[local[1] * 0xf + 2] = 1.0;
  if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
    local_590 = -1;
  }
  else {
    local_590 = ref_node_00->global[local[1]];
  }
  if (local_590 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_5b0 = -1;
    }
    else {
      local_5b0 = ref_node_00->global[local[1]];
    }
    local_5b8 = (REF_INT)(local_5b0 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_5c8 = -1;
    }
    else {
      local_5c8 = ref_node_00->global[local[1]];
    }
    local_5b8 = (int)((local_5c8 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[local[1]] = local_5b8;
  uVar2 = ref_cell_add(pRVar1->cell[8],&cell,&ref_private_macro_code_rss_1);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0xd1,
           "ref_fixture_tet2_grid",(ulong)uVar2,"add tet");
    return uVar2;
  }
LAB_0012a74c:
  ref_grid_ptr_local._4_4_ =
       ref_node_initialize_n_global(ref_node_00,(long)ref_private_macro_code_rss);
  if (ref_grid_ptr_local._4_4_ == 0) {
    ref_grid_ptr_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0xd4,
           "ref_fixture_tet2_grid",(ulong)ref_grid_ptr_local._4_4_,"init glob");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tet2_grid(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT nnodesg = 5;
  REF_INT cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;

  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);

    RSS(ref_cell_add(ref_grid_tet(ref_grid), local, &cell), "add tet");
  }

  global[0] = 4;
  global[1] = 2;
  global[2] = 1;
  global[3] = 3;

  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 1.0, 1.0, 1.0);
    add_that_node(1, 0.0, 1.0, 0.0);
    add_that_node(2, 1.0, 0.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);

    RSS(ref_cell_add(ref_grid_tet(ref_grid), local, &cell), "add tet");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}